

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O3

int AF_AActor_TraceBleed
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *missile;
  PClass *pPVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 in_register_00000014;
  undefined8 uVar5;
  undefined8 extraout_RDX;
  AActor *target;
  char *pcVar6;
  bool bVar7;
  PClass *pPVar4;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  uVar5 = CONCAT44(in_register_00000014,numparam);
  if (numparam < 1) {
    pcVar6 = "(paramnum) < numparam";
    goto LAB_0041780d;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_004177f4:
    pcVar6 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_0041780d:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x12cb,
                  "int AF_AActor_TraceBleed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  target = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (target == (AActor *)0x0) goto LAB_00417738;
    pPVar4 = (target->super_DThinker).super_DObject.Class;
    if (pPVar4 == (PClass *)0x0) {
      iVar2 = (**(target->super_DThinker).super_DObject._vptr_DObject)(target);
      pPVar4 = (PClass *)CONCAT44(extraout_var,iVar2);
      (target->super_DThinker).super_DObject.Class = pPVar4;
      uVar5 = extraout_RDX;
    }
    bVar7 = pPVar4 == (PClass *)0x0;
    ret = (VMReturn *)CONCAT71((int7)((ulong)ret >> 8),!bVar7);
    uVar5 = CONCAT71((int7)((ulong)uVar5 >> 8),bVar7);
    defaultparam = (TArray<VMValue,_VMValue> *)
                   CONCAT71((int7)((ulong)defaultparam >> 8),pPVar4 == pPVar1 || bVar7);
    if (pPVar4 != pPVar1 && !bVar7) {
      do {
        pPVar4 = pPVar4->ParentClass;
        ret = (VMReturn *)CONCAT71((int7)((ulong)ret >> 8),pPVar4 != (PClass *)0x0);
        if (pPVar4 == pPVar1) break;
      } while (pPVar4 != (PClass *)0x0);
    }
    if ((char)ret == '\0') {
      pcVar6 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0041780d;
    }
  }
  else {
    if (target != (AActor *)0x0) goto LAB_004177f4;
LAB_00417738:
    target = (AActor *)0x0;
  }
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam == 1) {
    pcVar6 = "(paramnum) < numparam";
  }
  else {
    if (param[1].field_0.field_3.Type == '\0') {
      if (numparam < 3) {
        pcVar6 = "(paramnum) < numparam";
      }
      else {
        if (param[2].field_0.field_3.Type == '\x03') {
          iVar2 = param[1].field_0.i;
          missile = (AActor *)param[2].field_0.field_1.a;
          if (param[2].field_0.field_1.atag == 1) {
            if (missile != (AActor *)0x0) {
              pPVar4 = (missile->super_DThinker).super_DObject.Class;
              if (pPVar4 == (PClass *)0x0) {
                iVar3 = (**(missile->super_DThinker).super_DObject._vptr_DObject)
                                  (missile,defaultparam,uVar5,ret);
                pPVar4 = (PClass *)CONCAT44(extraout_var_00,iVar3);
                (missile->super_DThinker).super_DObject.Class = pPVar4;
              }
              bVar7 = pPVar4 != (PClass *)0x0;
              if (pPVar4 != pPVar1 && bVar7) {
                do {
                  pPVar4 = pPVar4->ParentClass;
                  bVar7 = pPVar4 != (PClass *)0x0;
                  if (pPVar4 == pPVar1) break;
                } while (pPVar4 != (PClass *)0x0);
              }
              if (bVar7) {
                P_TraceBleed(iVar2,target,missile);
                return 0;
              }
              pcVar6 = "missile == NULL || missile->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0041785d;
            }
LAB_004177dd:
            P_TraceBleed(iVar2,target);
            return 0;
          }
          if (missile == (AActor *)0x0) goto LAB_004177dd;
        }
        pcVar6 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
      }
LAB_0041785d:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                    ,0x12cd,
                    "int AF_AActor_TraceBleed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pcVar6 = "param[paramnum].Type == REGT_INT";
  }
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                ,0x12cc,
                "int AF_AActor_TraceBleed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, TraceBleed)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT(damage);
	PARAM_OBJECT(missile, AActor);

	if (missile) P_TraceBleed(damage, self, missile);
	else P_TraceBleed(damage, self);
	return 0;
}